

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

void load_log(char *filename,int lines,cpu_log_t *buffer)

{
  FILE *__stream;
  long lVar1;
  long lVar2;
  ulong uVar3;
  uint32_t *puVar4;
  cpu_log_t *pcVar5;
  byte bVar6;
  char buf [10];
  cpu_log_t log;
  char local_8a [10];
  uint32_t local_80 [19];
  undefined4 local_34;
  
  bVar6 = 0;
  __stream = fopen(filename,"rb");
  if (0 < lines) {
    uVar3 = 0;
    do {
      fseek(__stream,2,1);
      fgets(local_8a,9,__stream);
      lVar1 = strtol(local_8a,(char **)0x0,0x10);
      local_80[0] = (uint32_t)lVar1;
      fseek(__stream,3,1);
      fgets(local_8a,9,__stream);
      lVar1 = strtol(local_8a,(char **)0x0,0x10);
      local_80[1] = (uint32_t)lVar1;
      fseek(__stream,3,1);
      fgets(local_8a,9,__stream);
      lVar1 = strtol(local_8a,(char **)0x0,0x10);
      local_80[2] = (uint32_t)lVar1;
      lVar1 = 3;
      do {
        fseek(__stream,3,1);
        fgets(local_8a,9,__stream);
        lVar2 = strtol(local_8a,(char **)0x0,0x10);
        local_80[lVar1] = (uint32_t)lVar2;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x13);
      fseek(__stream,1,1);
      fgets(local_8a,4,__stream);
      lVar1 = strtol(local_8a,(char **)0x0,10);
      local_34 = (undefined4)lVar1;
      fseek(__stream,1,1);
      puVar4 = local_80;
      pcVar5 = buffer + uVar3;
      for (lVar1 = 0x14; lVar1 != 0; lVar1 = lVar1 + -1) {
        pcVar5->address = *puVar4;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        pcVar5 = (cpu_log_t *)((long)pcVar5 + (ulong)bVar6 * -8 + 4);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)lines);
  }
  return;
}

Assistant:

void load_log(const char* filename, int lines, cpu_log_t* buffer) {
    FILE* fp = fopen(filename, "rb");
    char buf[10];
    for (int l = 0; l < lines; l++) {
        cpu_log_t log;
        fseek(fp, 2, SEEK_CUR); // Skip 0x
        fgets(buf, 9, fp);
        log.address = strtol(buf, NULL, 16);

        fseek(fp, 3, SEEK_CUR); // skip ,0x
        fgets(buf, 9, fp);
        log.instruction = strtol(buf, NULL, 16);

        fseek(fp, 3, SEEK_CUR); // skip ,0x
        fgets(buf, 9, fp);
        log.cpsr.raw = strtol(buf, NULL, 16);

        for (int r = 0; r < 16; r++) {
            fseek(fp, 3, SEEK_CUR); // skip ,0x
            fgets(buf, 9, fp);
            log.r[r] = strtol(buf, NULL, 16);
        }

        fseek(fp, 1, SEEK_CUR); // skip ,
        fgets(buf, 4, fp);
        log.cycles = strtol(buf, NULL, 10);

        fseek(fp, 1, SEEK_CUR); // Skip newline character

        buffer[l] = log;
    }
}